

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprAliasDefinition * AnalyzeTypedef(ExpressionContext *ctx,SynTypedef *syntax)

{
  ScopeData *scope;
  uint uVar1;
  TypeBase *pTVar2;
  AliasData *this;
  SynIdentifier *this_00;
  ExprAliasDefinition *this_01;
  InplaceStr name;
  AliasData *alias;
  InplaceStr aliasName;
  TypeBase *type;
  SynTypedef *syntax_local;
  ExpressionContext *ctx_local;
  
  uVar1 = InplaceStr::hash(&syntax->alias->name);
  pTVar2 = anon_unknown.dwarf_6f1cc::LookupTypeByName(ctx,uVar1);
  if (pTVar2 != (TypeBase *)0x0) {
    anon_unknown.dwarf_6f1cc::Stop
              (ctx,&syntax->super_SynBase,
               "ERROR: there is already a type or an alias with the same name");
  }
  pTVar2 = AnalyzeType(ctx,syntax->type,true,(bool *)0x0);
  if (pTVar2 == ctx->typeAuto) {
    anon_unknown.dwarf_6f1cc::Stop(ctx,&syntax->super_SynBase,"ERROR: can\'t alias \'auto\' type");
  }
  name = GetTypeNameInScope(ctx,ctx->scope,syntax->alias->name);
  this = ExpressionContext::get<AliasData>(ctx);
  scope = ctx->scope;
  this_00 = ExpressionContext::get<SynIdentifier>(ctx);
  SynIdentifier::SynIdentifier(this_00,syntax->alias,name);
  uVar1 = ctx->uniqueAliasId;
  ctx->uniqueAliasId = uVar1 + 1;
  AliasData::AliasData(this,&syntax->super_SynBase,scope,pTVar2,this_00,uVar1);
  ExpressionContext::AddAlias(ctx,this);
  this_01 = ExpressionContext::get<ExprAliasDefinition>(ctx);
  ExprAliasDefinition::ExprAliasDefinition(this_01,&syntax->super_SynBase,ctx->typeVoid,this);
  return this_01;
}

Assistant:

ExprAliasDefinition* AnalyzeTypedef(ExpressionContext &ctx, SynTypedef *syntax)
{
	if(LookupTypeByName(ctx, syntax->alias->name.hash()))
		Stop(ctx, syntax, "ERROR: there is already a type or an alias with the same name");

	TypeBase *type = AnalyzeType(ctx, syntax->type);

	if(type == ctx.typeAuto)
		Stop(ctx, syntax, "ERROR: can't alias 'auto' type");

	InplaceStr aliasName = GetTypeNameInScope(ctx, ctx.scope, syntax->alias->name);

	AliasData *alias = new (ctx.get<AliasData>()) AliasData(syntax, ctx.scope, type, new (ctx.get<SynIdentifier>()) SynIdentifier(syntax->alias, aliasName), ctx.uniqueAliasId++);

	ctx.AddAlias(alias);

	return new (ctx.get<ExprAliasDefinition>()) ExprAliasDefinition(syntax, ctx.typeVoid, alias);
}